

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

void insert_helper<QStringView>(QString *str,qsizetype i,QStringView *toInsert)

{
  QStringView v;
  QStringView v_00;
  QStringView v_01;
  bool bVar1;
  DataPointer *pDVar2;
  QChar *n;
  char16_t *pcVar3;
  QArrayDataPointer<char16_t> *this;
  QStringView *in_RDX;
  long in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  char16_t *insert_start;
  char16_t *old_end;
  char16_t *begin;
  QChar *insert_start_1;
  const_iterator cend;
  const_iterator cbegin;
  GrowthPosition side;
  qsizetype newSize;
  qsizetype insert_size;
  qsizetype oldSize;
  qsizetype difference;
  DataPointer *str_d;
  QString other;
  QString *in_stack_ffffffffffffff08;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff10;
  QChar *in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff20;
  QString *in_stack_ffffffffffffff28;
  QArrayDataPointer<char16_t> *in_stack_ffffffffffffff30;
  QArrayDataPointer<char16_t> *__result;
  undefined6 in_stack_ffffffffffffff38;
  undefined6 uVar4;
  QChar in_stack_ffffffffffffff3e;
  undefined2 uVar5;
  char16_t *in_stack_ffffffffffffff48;
  long local_88;
  QChar local_32 [9];
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = QString::data_ptr(in_RDI);
  local_88 = 0;
  if (pDVar2->size < in_RSI) {
    local_88 = in_RSI - pDVar2->size;
  }
  QStringView::size(in_RDX);
  bVar1 = QArrayDataPointer<char16_t>::needsDetach(in_stack_ffffffffffffff10);
  if ((bVar1) ||
     (bVar1 = needsReallocate(in_stack_ffffffffffffff20,(qsizetype)in_stack_ffffffffffffff18), bVar1
     )) {
    QString::cbegin((QString *)0x156b66);
    n = QString::cend((QString *)in_stack_ffffffffffffff10);
    if (local_88 == 0) {
      n = std::next<QChar_const*>
                    (in_stack_ffffffffffffff18,(difference_type)in_stack_ffffffffffffff10);
    }
    local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_20.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_20.d.size = -0x5555555555555556;
    QString::QString((QString *)0x156bec);
    QString::data_ptr(&local_20);
    QArrayDataPointer<char16_t>::detachAndGrow
              (in_stack_ffffffffffffff30,(GrowthPosition)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (qsizetype)n,(char16_t **)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    QStringView::QStringView<QChar,_true>
              ((QStringView *)in_stack_ffffffffffffff10,(QChar *)in_stack_ffffffffffffff08,
               (QChar *)0x156c29);
    v.m_size._0_6_ = in_stack_ffffffffffffff38;
    v.m_data = (storage_type_conflict *)in_stack_ffffffffffffff30;
    v.m_size._6_2_ = in_stack_ffffffffffffff3e.ucs;
    QString::append(in_stack_ffffffffffffff28,v);
    QChar::QChar<char16_t,_true>(local_32,L' ');
    QString::resize((QString *)in_stack_ffffffffffffff30,(qsizetype)in_stack_ffffffffffffff28,
                    in_stack_ffffffffffffff3e);
    v_00.m_size._0_6_ = in_stack_ffffffffffffff38;
    v_00.m_data = (storage_type_conflict *)in_stack_ffffffffffffff30;
    v_00.m_size._6_2_ = in_stack_ffffffffffffff3e.ucs;
    QString::append(in_stack_ffffffffffffff28,v_00);
    QStringView::QStringView<QChar,_true>
              ((QStringView *)in_stack_ffffffffffffff10,(QChar *)in_stack_ffffffffffffff08,
               (QChar *)0x156cd2);
    v_01.m_size._0_6_ = in_stack_ffffffffffffff38;
    v_01.m_data = (storage_type_conflict *)in_stack_ffffffffffffff30;
    v_01.m_size._6_2_ = in_stack_ffffffffffffff3e.ucs;
    QString::append(in_stack_ffffffffffffff28,v_01);
    QString::swap((QString *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    QString::~QString((QString *)0x156d11);
  }
  else {
    QArrayDataPointer<char16_t>::detachAndGrow
              (in_stack_ffffffffffffff30,(GrowthPosition)((ulong)in_stack_ffffffffffffff28 >> 0x20),
               (qsizetype)in_stack_ffffffffffffff20,(char16_t **)in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10);
    qt_noop();
    QString::resize((QString *)in_stack_ffffffffffffff10,(qsizetype)in_stack_ffffffffffffff08);
    pcVar3 = QArrayDataPointer<char16_t>::begin((QArrayDataPointer<char16_t> *)0x156d57);
    uVar4 = SUB86(pcVar3,0);
    uVar5 = (undefined2)((ulong)pcVar3 >> 0x30);
    this = (QArrayDataPointer<char16_t> *)
           std::next<char16_t*>
                     (&in_stack_ffffffffffffff18->ucs,(difference_type)in_stack_ffffffffffffff10);
    std::fill_n<char16_t*,long_long,char16_t>
              ((char16_t *)CONCAT26(uVar5,uVar4),(longlong)this,
               (char16_t *)in_stack_ffffffffffffff28);
    std::next<char16_t*>(&in_stack_ffffffffffffff18->ucs,(difference_type)in_stack_ffffffffffffff10)
    ;
    __result = this;
    if (local_88 == 0) {
      QArrayDataPointer<char16_t>::end(this);
      std::move_backward<char16_t*,char16_t*>
                ((char16_t *)in_stack_ffffffffffffff20,&in_stack_ffffffffffffff18->ucs,
                 (char16_t *)this);
    }
    QStringView::data(in_RDX);
    std::copy_n<char16_t_const*,long_long,char16_t*>
              (in_stack_ffffffffffffff48,CONCAT26(uVar5,uVar4),(char16_t *)__result);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void insert_helper(QString &str, qsizetype i, const T &toInsert)
{
    auto &str_d = str.data_ptr();
    qsizetype difference = 0;
    if (Q_UNLIKELY(i > str_d.size))
        difference = i - str_d.size;
    const qsizetype oldSize = str_d.size;
    const qsizetype insert_size = toInsert.size();
    const qsizetype newSize = str_d.size + difference + insert_size;
    const auto side = i == 0 ? QArrayData::GrowsAtBeginning : QArrayData::GrowsAtEnd;

    if (str_d.needsDetach() || needsReallocate(str, newSize)) {
        const auto cbegin = str.cbegin();
        const auto cend = str.cend();
        const auto insert_start = difference == 0 ? std::next(cbegin, i) : cend;
        QString other;
        // Using detachAndGrow() so that prepend optimization works and QStringBuilder
        // unittests pass
        other.data_ptr().detachAndGrow(side, newSize, nullptr, nullptr);
        other.append(QStringView(cbegin, insert_start));
        other.resize(i, u' ');
        other.append(toInsert);
        other.append(QStringView(insert_start, cend));
        str.swap(other);
        return;
    }

    str_d.detachAndGrow(side, difference + insert_size, nullptr, nullptr);
    Q_CHECK_PTR(str_d.data());
    str.resize(newSize);

    auto begin = str_d.begin();
    auto old_end = std::next(begin, oldSize);
    std::fill_n(old_end, difference, u' ');
    auto insert_start = std::next(begin, i);
    if (difference == 0)
        std::move_backward(insert_start, old_end, str_d.end());

    using Char = std::remove_cv_t<typename T::value_type>;
    if constexpr(std::is_same_v<Char, QChar>)
        std::copy_n(reinterpret_cast<const char16_t *>(toInsert.data()), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char16_t>)
        std::copy_n(toInsert.data(), insert_size, insert_start);
    else if constexpr (std::is_same_v<Char, char>)
        qt_from_latin1(insert_start, toInsert.data(), insert_size);
}